

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear.cpp
# Opt level: O1

void __thiscall
LinearGE<0,_1>::LinearGE(LinearGE<0,_1> *this,vec<int> *a,vec<IntVar_*> *_x,int _c,BoolView *_r)

{
  IntVar ***pppIVar1;
  int *piVar2;
  undefined8 uVar3;
  uint pos;
  ulong uVar4;
  IntView<0> local_48;
  vec<IntView<1>_> *local_38;
  
  (this->super_Propagator)._vptr_Propagator = (_func_int **)&PTR__Propagator_0020fe18;
  (this->super_Propagator).prop_id = engine.propagators.sz;
  (this->super_Propagator).priority = 0;
  (this->super_Propagator).satisfied = '\0';
  (this->super_Propagator).in_queue = false;
  local_48.var = (IntVar *)this;
  vec<Propagator_*>::push(&engine.propagators,(Propagator **)&local_48);
  (this->super_Propagator)._vptr_Propagator = (_func_int **)&PTR__LinearGE_00212390;
  vec<int>::vec(&this->pos,_x->sz);
  (this->y).sz = 0;
  (this->y).cap = 0;
  (this->y).data = (IntView<1> *)0x0;
  (this->x).sz = 0;
  (this->x).cap = 0;
  (this->x).data = (IntView<0> *)0x0;
  this->c = _c;
  (this->r).super_Var.super_Branching._vptr_Branching = (_func_int **)&PTR_finished_0020fb28;
  (this->r).v = _r->v;
  (this->r).s = _r->s;
  this->fix = 0;
  this->fix_x = 0;
  this->fix_y = 0;
  this->fix_sum = (long)-_c;
  vec<Lit>::vec(&this->ps,_x->sz + 1);
  (this->super_Propagator).priority = 2;
  pos = _x->sz;
  if (pos != 0) {
    local_38 = &this->y;
    pppIVar1 = &_x->data;
    uVar4 = 0;
    do {
      piVar2 = a->data;
      if (piVar2[uVar4] < 1) {
        (this->pos).data[uVar4] = ~(this->y).sz;
        local_48.a = -piVar2[uVar4];
        local_48.var = (*pppIVar1)[uVar4];
        local_48.b = 0;
        vec<IntView<1>_>::push(local_38,(IntView<1> *)&local_48);
        uVar3 = 2;
      }
      else {
        (this->pos).data[uVar4] = (this->x).sz;
        local_48.var = (*pppIVar1)[uVar4];
        local_48.a = piVar2[uVar4];
        local_48.b = 0;
        vec<IntView<0>_>::push(&this->x,&local_48);
        uVar3 = 4;
      }
      (*((*pppIVar1)[uVar4]->super_Var).super_Branching._vptr_Branching[7])
                ((*pppIVar1)[uVar4],this,uVar4 & 0xffffffff,uVar3);
      uVar4 = uVar4 + 1;
      pos = _x->sz;
    } while (uVar4 < pos);
  }
  BoolView::attach(&this->r,&this->super_Propagator,pos,2);
  return;
}

Assistant:

LinearGE(vec<int>& a, vec<IntVar*>& _x, int _c, BoolView _r = bv_true)
			: pos(_x.size()),
				c(_c),
				r(std::move(_r)),

				fix_sum(-c),
				ps(R + _x.size()) {
		priority = 2;

		for (unsigned int i = 0; i < _x.size(); i++) {
			assert(a[i]);
			if (a[i] > 0) {
				pos[i] = x.size();
				x.push(IntView<2 * S>(_x[i], a[i]));
				_x[i]->attach(this, i, EVENT_U);
			} else {
				pos[i] = -static_cast<int>(y.size()) - 1;
				y.push(IntView<2 * S + 1>(_x[i], -a[i]));
				_x[i]->attach(this, i, EVENT_L);
			}
		}
		if (R != 0) {
			r.attach(this, _x.size(), EVENT_L);
		}
	}